

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::RALocalAllocator::replaceAssignment
          (RALocalAllocator *this,PhysToWorkMap *physToWorkMap)

{
  PhysToWorkMap *in_RSI;
  RAAssignment *in_RDI;
  
  RAAssignment::copyFrom(in_RDI,in_RSI);
  return 0;
}

Assistant:

Error RALocalAllocator::replaceAssignment(const PhysToWorkMap* physToWorkMap) noexcept {
  _curAssignment.copyFrom(physToWorkMap);
  return kErrorOk;
}